

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_msl_resource_binding(CompilerMSL *this,MSLResourceBinding *binding)

{
  mapped_type mVar1;
  mapped_type *this_00;
  mapped_type *pmVar2;
  CompilerError *this_01;
  undefined1 local_58 [8];
  StageSetBinding arg_idx_tuple;
  undefined1 local_24 [8];
  StageSetBinding tuple;
  MSLResourceBinding *binding_local;
  CompilerMSL *this_local;
  
  local_24._0_4_ = binding->stage;
  local_24._4_4_ = binding->desc_set;
  tuple.model = binding->binding;
  arg_idx_tuple.desc_set._3_1_ = 0;
  tuple._4_8_ = binding;
  ::std::pair<spirv_cross::MSLResourceBinding,_bool>::pair<bool,_true>
            ((pair<spirv_cross::MSLResourceBinding,_bool> *)&arg_idx_tuple.binding,binding,
             (bool *)((long)&arg_idx_tuple.desc_set + 3));
  this_00 = ::std::
            unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>_>
            ::operator[](&this->resource_bindings,(key_type *)local_24);
  ::std::pair<spirv_cross::MSLResourceBinding,_bool>::operator=
            (this_00,(type)&arg_idx_tuple.binding);
  if (((this->msl_options).pad_argument_buffer_resources & 1U) != 0) {
    local_58._0_4_ = *(undefined4 *)tuple._4_8_;
    local_58._4_4_ = *(uint32_t *)(tuple._4_8_ + 8);
    arg_idx_tuple.model = ~ExecutionModelVertex;
    switch(*(undefined4 *)(tuple._4_8_ + 4)) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      arg_idx_tuple.model = *(ExecutionModel *)(tuple._4_8_ + 0x14);
      mVar1 = *(mapped_type *)(tuple._4_8_ + 0xc);
      pmVar2 = ::std::
               unordered_map<spirv_cross::StageSetBinding,_unsigned_int,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>_>
               ::operator[](&this->resource_arg_buff_idx_to_binding_number,(key_type *)local_58);
      *pmVar2 = mVar1;
      break;
    default:
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,
                 "Unexpected argument buffer resource base type. When padding argument buffer elements, all descriptor set resources must be supplied with a base type by the app."
                );
      __cxa_throw(this_01,&CompilerError::typeinfo,CompilerError::~CompilerError);
    case 0x10:
      arg_idx_tuple.model = *(ExecutionModel *)(tuple._4_8_ + 0x18);
      mVar1 = *(mapped_type *)(tuple._4_8_ + 0xc);
      pmVar2 = ::std::
               unordered_map<spirv_cross::StageSetBinding,_unsigned_int,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>_>
               ::operator[](&this->resource_arg_buff_idx_to_binding_number,(key_type *)local_58);
      *pmVar2 = mVar1;
      break;
    case 0x11:
      arg_idx_tuple.model = *(ExecutionModel *)(tuple._4_8_ + 0x18);
      mVar1 = *(mapped_type *)(tuple._4_8_ + 0xc);
      pmVar2 = ::std::
               unordered_map<spirv_cross::StageSetBinding,_unsigned_int,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>_>
               ::operator[](&this->resource_arg_buff_idx_to_binding_number,(key_type *)local_58);
      *pmVar2 = mVar1;
      arg_idx_tuple.model = *(ExecutionModel *)(tuple._4_8_ + 0x1c);
      mVar1 = *(mapped_type *)(tuple._4_8_ + 0xc);
      pmVar2 = ::std::
               unordered_map<spirv_cross::StageSetBinding,_unsigned_int,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>_>
               ::operator[](&this->resource_arg_buff_idx_to_binding_number,(key_type *)local_58);
      *pmVar2 = mVar1;
      break;
    case 0x12:
      arg_idx_tuple.model = *(ExecutionModel *)(tuple._4_8_ + 0x1c);
      mVar1 = *(mapped_type *)(tuple._4_8_ + 0xc);
      pmVar2 = ::std::
               unordered_map<spirv_cross::StageSetBinding,_unsigned_int,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>_>
               ::operator[](&this->resource_arg_buff_idx_to_binding_number,(key_type *)local_58);
      *pmVar2 = mVar1;
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_msl_resource_binding(const MSLResourceBinding &binding)
{
	StageSetBinding tuple = { binding.stage, binding.desc_set, binding.binding };
	resource_bindings[tuple] = { binding, false };

	// If we might need to pad argument buffer members to positionally align
	// arg buffer indexes, also maintain a lookup by argument buffer index.
	if (msl_options.pad_argument_buffer_resources)
	{
		StageSetBinding arg_idx_tuple = { binding.stage, binding.desc_set, k_unknown_component };

#define ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(rez) \
	arg_idx_tuple.binding = binding.msl_##rez; \
	resource_arg_buff_idx_to_binding_number[arg_idx_tuple] = binding.binding

		switch (binding.basetype)
		{
		case SPIRType::Void:
		case SPIRType::Boolean:
		case SPIRType::SByte:
		case SPIRType::UByte:
		case SPIRType::Short:
		case SPIRType::UShort:
		case SPIRType::Int:
		case SPIRType::UInt:
		case SPIRType::Int64:
		case SPIRType::UInt64:
		case SPIRType::AtomicCounter:
		case SPIRType::Half:
		case SPIRType::Float:
		case SPIRType::Double:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(buffer);
			break;
		case SPIRType::Image:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(texture);
			break;
		case SPIRType::Sampler:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(sampler);
			break;
		case SPIRType::SampledImage:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(texture);
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(sampler);
			break;
		default:
			SPIRV_CROSS_THROW("Unexpected argument buffer resource base type. When padding argument buffer elements, "
			                  "all descriptor set resources must be supplied with a base type by the app.");
		}
#undef ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP
	}
}